

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void disableRawMouseMotion(_GLFWwindow *window)

{
  uchar mask [1];
  XIEventMask em;
  uchar local_19;
  XIEventMask local_18;
  
  memset(&local_19,0,1);
  local_18.deviceid = 1;
  local_18.mask_len = 1;
  local_18.mask = &local_19;
  (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&local_18,1);
  return;
}

Assistant:

static void disableRawMouseMotion(_GLFWwindow* window)
{
    XIEventMask em;
    unsigned char mask[] = { 0 };

    em.deviceid = XIAllMasterDevices;
    em.mask_len = sizeof(mask);
    em.mask = mask;

    XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
}